

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_2_channels_with_3_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  __m128 d;
  __m128 cs;
  __m128 c;
  __m128 tot;
  float *hc;
  float *decode;
  float *output;
  float *output_end;
  float *pfStack_180;
  int coefficient_width_local;
  float *horizontal_coefficients_local;
  stbir__contributors *horizontal_contributors_local;
  float *decode_buffer_local;
  uint output_sub_size_local;
  float *output_buffer_local;
  float fStack_e0;
  float local_d8;
  float fStack_d4;
  float local_b8;
  float fStack_b4;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  
  decode = output_buffer;
  pfStack_180 = horizontal_coefficients;
  horizontal_coefficients_local = (float *)horizontal_contributors;
  do {
    pfVar1 = decode_buffer + (int)*horizontal_coefficients_local * 2;
    local_d8 = (float)*(undefined8 *)pfStack_180;
    fStack_d4 = (float)((ulong)*(undefined8 *)pfStack_180 >> 0x20);
    local_a8 = (float)*(undefined8 *)pfVar1;
    fStack_a4 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
    fStack_a0 = (float)*(undefined8 *)(pfVar1 + 2);
    fStack_9c = (float)((ulong)*(undefined8 *)(pfVar1 + 2) >> 0x20);
    fStack_e0 = (float)*(undefined8 *)(pfStack_180 + 2);
    local_b8 = (float)*(undefined8 *)(pfVar1 + 4);
    fStack_b4 = (float)((ulong)*(undefined8 *)(pfVar1 + 4) >> 0x20);
    *(ulong *)decode =
         CONCAT44(local_d8 * fStack_a4 + fStack_b4 * fStack_e0 +
                  fStack_d4 * fStack_9c + fStack_e0 * 0.0,
                  local_d8 * local_a8 + local_b8 * fStack_e0 +
                  fStack_d4 * fStack_a0 + fStack_e0 * 0.0);
    pfStack_180 = pfStack_180 + coefficient_width;
    horizontal_coefficients_local = horizontal_coefficients_local + 2;
    decode = decode + 2;
  } while (decode < output_buffer + (output_sub_size << 1));
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_3_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__3_coeff_only();
    stbir__store_output_tiny();
  } while ( output < output_end );
}